

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<bool,char_const(&)[1]>
          (String *__return_storage_ptr__,kj *this,bool *params,char (*params_1) [1])

{
  bool *value;
  char (*value_00) [1];
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  char (*local_20) [1];
  char (*params_local_1) [1];
  bool *params_local;
  
  local_20 = (char (*) [1])params;
  params_local_1 = (char (*) [1])this;
  params_local = (bool *)__return_storage_ptr__;
  value = fwd<bool>((NoInfer<bool> *)this);
  local_30 = (ArrayPtr<const_char>)toCharSequence<bool>(value);
  value_00 = ::const(local_20);
  local_40 = toCharSequence<char_const(&)[1]>(value_00);
  _::concat<kj::StringPtr,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,(StringPtr *)&local_40,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}